

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XCryptionCommon.cpp
# Opt level: O0

ByteList * __thiscall
XCryptionCommon::algorithm3_3
          (ByteList *__return_storage_ptr__,XCryptionCommon *this,uint inRevision,uint inLength,
          ByteList *inOwnerPassword,ByteList *inUserPassword)

{
  bool bVar1;
  size_type sVar2;
  ByteList *pBVar3;
  byte *pbVar4;
  ByteList local_2e8;
  byte local_2c9;
  _Self local_2c8;
  _Self local_2c0;
  iterator it;
  ByteList newRC4Key;
  undefined1 local_298 [7];
  Byte i_1;
  undefined1 local_280 [8];
  ByteList RC4Key;
  MD5Generator anotherMD5;
  int i;
  MD5Generator md5;
  ByteList local_b8;
  undefined1 local_a0 [8];
  ByteList userPassword32Chars;
  ByteList local_78;
  ByteList local_60;
  undefined1 local_48 [8];
  ByteList ownerPassword32Chars;
  ByteList *inUserPassword_local;
  ByteList *inOwnerPassword_local;
  uint inLength_local;
  uint inRevision_local;
  XCryptionCommon *this_local;
  ByteList *hashResult;
  
  ownerPassword32Chars.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  _M_node._M_size = (size_t)inUserPassword;
  substr(&local_60,inOwnerPassword,0,0x20);
  sVar2 = std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::size(inOwnerPassword);
  if (sVar2 < 0x20) {
    sVar2 = std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::size(inOwnerPassword)
    ;
    substr(&local_78,&this->mPaddingFiller,0,0x20 - sVar2);
  }
  else {
    memset(&local_78,0,0x18);
    std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::list(&local_78);
  }
  add((ByteList *)local_48,&local_60,&local_78);
  std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::~list(&local_78);
  std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::~list(&local_60);
  substr(&local_b8,
         (ByteList *)
         ownerPassword32Chars.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl._M_node._M_size,0,0x20);
  sVar2 = std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((list<unsigned_char,_std::allocator<unsigned_char>_> *)
                     ownerPassword32Chars.
                     super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl._M_node
                     ._M_size);
  if (sVar2 < 0x20) {
    sVar2 = std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((list<unsigned_char,_std::allocator<unsigned_char>_> *)
                       ownerPassword32Chars.
                       super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       _M_node._M_size);
    substr((ByteList *)&md5.mIsFinalized,&this->mPaddingFiller,0,0x20 - sVar2);
  }
  else {
    memset(&md5.mIsFinalized,0,0x18);
    std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::list
              ((list<unsigned_char,_std::allocator<unsigned_char>_> *)&md5.mIsFinalized);
  }
  add((ByteList *)local_a0,&local_b8,(ByteList *)&md5.mIsFinalized);
  std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::~list
            ((list<unsigned_char,_std::allocator<unsigned_char>_> *)&md5.mIsFinalized);
  std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::~list(&local_b8);
  MD5Generator::MD5Generator((MD5Generator *)&i);
  std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::list(__return_storage_ptr__);
  MD5Generator::Accumulate((MD5Generator *)&i,(ByteList *)local_48);
  pBVar3 = MD5Generator::ToString_abi_cxx11_((MD5Generator *)&i);
  std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (__return_storage_ptr__,pBVar3);
  if (2 < inRevision) {
    anotherMD5.mIsFinalized = false;
    anotherMD5._193_3_ = 0;
    for (; (int)anotherMD5._192_4_ < 0x32; anotherMD5._192_4_ = anotherMD5._192_4_ + 1) {
      MD5Generator::MD5Generator
                ((MD5Generator *)
                 &RC4Key.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  _M_node._M_size);
      MD5Generator::Accumulate
                ((MD5Generator *)
                 &RC4Key.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  _M_node._M_size,__return_storage_ptr__);
      pBVar3 = MD5Generator::ToString_abi_cxx11_
                         ((MD5Generator *)
                          &RC4Key.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl._M_node._M_size);
      std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (__return_storage_ptr__,pBVar3);
      MD5Generator::~MD5Generator
                ((MD5Generator *)
                 &RC4Key.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  _M_node._M_size);
    }
  }
  if (inRevision == 2) {
    substr((ByteList *)local_280,__return_storage_ptr__,0,5);
  }
  else {
    substr((ByteList *)local_280,__return_storage_ptr__,0,(ulong)inLength);
  }
  RC4Encode((ByteList *)local_298,this,(ByteList *)local_280,(ByteList *)local_a0);
  std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (__return_storage_ptr__,(list<unsigned_char,_std::allocator<unsigned_char>_> *)local_298
            );
  std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::~list
            ((list<unsigned_char,_std::allocator<unsigned_char>_> *)local_298);
  if (2 < inRevision) {
    for (newRC4Key.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl._M_node.
         _M_size._7_1_ = 1;
        newRC4Key.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl._M_node.
        _M_size._7_1_ < 0x14;
        newRC4Key.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl._M_node.
        _M_size._7_1_ =
             newRC4Key.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             _M_node._M_size._7_1_ + 1) {
      std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::list
                ((list<unsigned_char,_std::allocator<unsigned_char>_> *)&it);
      local_2c0._M_node =
           (_List_node_base *)
           std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::begin
                     ((list<unsigned_char,_std::allocator<unsigned_char>_> *)local_280);
      while( true ) {
        local_2c8._M_node =
             (_List_node_base *)
             std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::end
                       ((list<unsigned_char,_std::allocator<unsigned_char>_> *)local_280);
        bVar1 = std::operator!=(&local_2c0,&local_2c8);
        if (!bVar1) break;
        pbVar4 = std::_List_iterator<unsigned_char>::operator*(&local_2c0);
        local_2c9 = *pbVar4 ^ newRC4Key.
                              super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl._M_node._M_size._7_1_;
        std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  ((list<unsigned_char,_std::allocator<unsigned_char>_> *)&it,&local_2c9);
        std::_List_iterator<unsigned_char>::operator++(&local_2c0);
      }
      RC4Encode(&local_2e8,this,(ByteList *)&it,__return_storage_ptr__);
      std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (__return_storage_ptr__,&local_2e8);
      std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::~list(&local_2e8);
      std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::~list
                ((list<unsigned_char,_std::allocator<unsigned_char>_> *)&it);
    }
  }
  std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::~list
            ((list<unsigned_char,_std::allocator<unsigned_char>_> *)local_280);
  MD5Generator::~MD5Generator((MD5Generator *)&i);
  std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::~list
            ((list<unsigned_char,_std::allocator<unsigned_char>_> *)local_a0);
  std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::~list
            ((list<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  return __return_storage_ptr__;
}

Assistant:

ByteList XCryptionCommon::algorithm3_3(unsigned int inRevision,
	unsigned int inLength,
	const ByteList& inOwnerPassword,
	const ByteList& inUserPassword) {
	ByteList ownerPassword32Chars = add(substr(inOwnerPassword, 0, 32), (inOwnerPassword.size()<32 ? substr(mPaddingFiller, 0, 32 - inOwnerPassword.size()) : ByteList()));
	ByteList userPassword32Chars = add(substr(inUserPassword, 0, 32), (inUserPassword.size()<32 ? substr(mPaddingFiller, 0, 32 - inUserPassword.size()) : ByteList()));
	MD5Generator md5;
	ByteList hashResult;

	md5.Accumulate(ownerPassword32Chars);

	hashResult = md5.ToString();

	if (inRevision >= 3) {
		for (int i = 0; i < 50; ++i) {
			MD5Generator anotherMD5;
			anotherMD5.Accumulate(hashResult);
			hashResult = anotherMD5.ToString();
		}
	}

	ByteList RC4Key = (inRevision == 2 ? substr(hashResult, 0, 5) : substr(hashResult, 0, inLength));

	hashResult = RC4Encode(RC4Key, userPassword32Chars);

	if (inRevision >= 3) {
		for (Byte i = 1; i <= 19; ++i) {
			ByteList newRC4Key;
			ByteList::iterator it = RC4Key.begin();
			for (; it != RC4Key.end(); ++it)
				newRC4Key.push_back((*it) ^ i);
			hashResult = RC4Encode(newRC4Key, hashResult);
		}
	}

	return hashResult;
}